

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::CZString::CZString(CZString *this,CZString *other)

{
  char *__src;
  uint uVar1;
  char *__dest;
  uint uVar2;
  ulong __n;
  String local_48;
  
  if ((((other->field_1).index_ & 3) == 0) || (__src = other->cstr_, __src == (char *)0x0)) {
    __dest = other->cstr_;
  }
  else {
    __n = (ulong)((other->field_1).index_ >> 2);
    __dest = (char *)malloc(__n + 1);
    if (__dest == (char *)0x0) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,
                 "in Json::Value::duplicateStringValue(): Failed to allocate string value buffer",""
                );
      throwRuntimeError(&local_48);
    }
    memcpy(__dest,__src,__n);
    __dest[__n] = '\0';
  }
  this->cstr_ = __dest;
  uVar1 = (other->field_1).index_ & 3;
  uVar2 = (uint)(uVar1 != 0);
  if (other->cstr_ == (char *)0x0) {
    uVar2 = uVar1;
  }
  (this->field_1).index_ = (this->field_1).index_ & 0xfffffffc | uVar2;
  (this->field_1).index_ = (other->field_1).index_ & 0xfffffffc | uVar2;
  return;
}

Assistant:

Value::CZString::CZString(const CZString& other) {
  cstr_ = (other.storage_.policy_ != noDuplication && other.cstr_ != nullptr
               ? duplicateStringValue(other.cstr_, other.storage_.length_)
               : other.cstr_);
  storage_.policy_ =
      static_cast<unsigned>(
          other.cstr_
              ? (static_cast<DuplicationPolicy>(other.storage_.policy_) ==
                         noDuplication
                     ? noDuplication
                     : duplicate)
              : static_cast<DuplicationPolicy>(other.storage_.policy_)) &
      3U;
  storage_.length_ = other.storage_.length_;
}